

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::GetAttributesWithPropertyIndex
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,PropertyId propertyId,
          BigPropertyIndex index,PropertyAttributes *attributes)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  BOOL BVar5;
  
  BVar5 = 0;
  if (index < this->propertyCount) {
    if ((this->descriptors[index].Id.ptr)->pid != propertyId) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                  ,0x440,"(descriptors[index].Id->GetPropertyId() == propertyId)",
                                  "descriptors[index].Id->GetPropertyId() == propertyId");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    bVar1 = this->descriptors[index].field_1.Attributes;
    BVar5 = 0;
    if ((bVar1 & 8) == 0) {
      *attributes = bVar1 & 7;
      BVar5 = 1;
    }
  }
  return BVar5;
}

Assistant:

BOOL SimpleTypeHandler<size>::GetAttributesWithPropertyIndex(DynamicObject * instance, PropertyId propertyId, BigPropertyIndex index, PropertyAttributes * attributes)
    {
        if (index >= propertyCount) { return false; }
        Assert(descriptors[index].Id->GetPropertyId() == propertyId);
        if (descriptors[index].Attributes & PropertyDeleted)
        {
            return false;
        }
        *attributes = descriptors[index].Attributes & PropertyDynamicTypeDefaults;
        return true;
    }